

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefitool.cpp
# Opt level: O0

void __thiscall UEFITool::goToAddress(UEFITool *this)

{
  TreeModel *this_00;
  bool bVar1;
  int iVar2;
  UINT64 UVar3;
  long *plVar4;
  QFlags<QItemSelectionModel::SelectionFlag> local_38;
  Int local_34;
  undefined1 local_30 [8];
  QModelIndex index;
  UINT32 address;
  UEFITool *this_local;
  
  QWidget::setFocus((QWidget *)(this->goToAddressDialog->ui->super_Ui_GoToAddressDialog).hexSpinBox)
  ;
  QAbstractSpinBox::selectAll();
  iVar2 = (**(code **)(*(long *)this->goToAddressDialog + 0x1a8))();
  if (iVar2 == 1) {
    iVar2 = QSpinBox::value();
    this_00 = this->model;
    index.m._4_4_ = iVar2;
    UVar3 = FfsParser::getAddressDiff(this->ffsParser);
    TreeModel::findByBase((QModelIndex *)local_30,this_00,iVar2 - (int)UVar3);
    bVar1 = QModelIndex::isValid((QModelIndex *)local_30);
    if (bVar1) {
      (**(code **)(**(long **)(this->ui + 0x130) + 0x1e8))(*(long **)(this->ui + 0x130),local_30,3);
      plVar4 = (long *)QAbstractItemView::selectionModel();
      local_38 = operator|(Select,Rows);
      local_34 = (Int)QFlags<QItemSelectionModel::SelectionFlag>::operator|(&local_38,Clear);
      (**(code **)(*plVar4 + 0x68))(plVar4,local_30,local_34);
    }
  }
  return;
}

Assistant:

void UEFITool::goToAddress()
{
    goToAddressDialog->ui->hexSpinBox->setFocus();
    goToAddressDialog->ui->hexSpinBox->selectAll();
    if (goToAddressDialog->exec() != QDialog::Accepted)
        return;
    
    UINT32 address = (UINT32)goToAddressDialog->ui->hexSpinBox->value();
    QModelIndex index = model->findByBase(address - (UINT32)ffsParser->getAddressDiff());
    if (index.isValid()) {
        ui->structureTreeView->scrollTo(index, QAbstractItemView::PositionAtCenter);
        ui->structureTreeView->selectionModel()->select(index, QItemSelectionModel::Select | QItemSelectionModel::Rows | QItemSelectionModel::Clear);
    }
}